

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O3

void __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
::TPZFrontMatrix(TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
                 *this,TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
                       *cp)

{
  int64_t iVar1;
  char cVar2;
  
  (this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)&PTR__TPZBaseMatrix_0198d220;
  iVar1 = (cp->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
          super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol;
  (this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow =
       (cp->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
       super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow;
  (this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = iVar1;
  cVar2 = (cp->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
          super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed =
       (cp->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
       super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive = cVar2;
  (this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)&PTR__TPZFrontMatrix_01983b48;
  TPZFileEqnStorage<std::complex<long_double>_>::TPZFileEqnStorage(&this->fStorage,&cp->fStorage);
  TPZFront<std::complex<long_double>_>::TPZFront
            (&(this->fFront).super_TPZFront<std::complex<long_double>_>,&PTR_PTR_0198f1d0,
             &(cp->fFront).super_TPZFront<std::complex<long_double>_>);
  (this->fFront).super_TPZFront<std::complex<long_double>_>.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFrontSym_0198f158;
  iVar1 = cp->fLastDecomposed;
  this->fNumEq = cp->fNumEq;
  this->fLastDecomposed = iVar1;
  TPZVec<int>::TPZVec(&this->fNumElConnected,&cp->fNumElConnected);
  TPZVec<int>::TPZVec(&this->fNumElConnectedBackup,&cp->fNumElConnectedBackup);
  return;
}

Assistant:

TPZFrontMatrix(const TPZFrontMatrix &cp) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),TPZAbstractFrontMatrix<TVar>(cp), fStorage(cp.fStorage),
	fFront(cp.fFront),fNumEq(cp.fNumEq),fLastDecomposed(cp.fLastDecomposed), fNumElConnected(cp.fNumElConnected),fNumElConnectedBackup(cp.fNumElConnectedBackup)
    {
    }